

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O2

void speak_file(OpenJTalk *openjtalk,FILE *fp)

{
  int iVar1;
  char *pcVar2;
  char line [1001];
  
  if (fp != (FILE *)0x0) {
    iVar1 = getc((FILE *)fp);
    if ((((char)iVar1 != -0x11) || (iVar1 = getc((FILE *)fp), (char)iVar1 != -0x45)) ||
       (iVar1 = getc((FILE *)fp), (char)iVar1 != -0x41)) {
      fseek((FILE *)fp,0,0);
    }
    while (pcVar2 = fgets(line,0x104,(FILE *)fp), pcVar2 != (char *)0x0) {
      remove_cr_lf(line);
      if (line[0] != '\0') {
        openjtalk_speakSync(openjtalk,line);
      }
    }
    fclose((FILE *)fp);
    return;
  }
  exit(1);
}

Assistant:

void speak_file(OpenJTalk *openjtalk, FILE* fp)
{
	char line[MAX_LENGTH + 1];

	if (fp == NULL)
	{
		exit(EXIT_FAILURE);
	}

	if ((getc(fp) & 0xFF) != 0xEF || (getc(fp) & 0xFF) != 0xBB || (getc(fp) & 0xFF) != 0xBF)
	{
		fseek(fp, 0, SEEK_SET);
	}

	while (fgets(line, MAX_PATH, fp) != NULL)
	{
		remove_cr_lf(line);
		if (strlen(line) == 0)
		{
			continue;
		}

		openjtalk_speakSync(openjtalk, line);
	}
	fclose(fp);
}